

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

Cut_Man_t * Abc_NtkCuts(Abc_Ntk_t *pNtk,Cut_Params_t *pParams)

{
  Abc_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Cut_Man_t *p;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p_00;
  ProgressBar *p_01;
  uint *puVar7;
  abctime aVar8;
  uint uVar9;
  ulong uVar10;
  int nCapMin;
  Cut_Man_t *pCVar11;
  char *__assertion;
  int iVar12;
  uint uVar13;
  Cut_Cut_t *pCut;
  
  aVar4 = Abc_Clock();
  if (pParams->fAdjust != 0) {
    Abc_NtkCutsSubtractFanunt(pNtk);
  }
  nEqual = 0;
  nGood = 0;
  nTotal = 0;
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                  ,0x8d,"Cut_Man_t *Abc_NtkCuts(Abc_Ntk_t *, Cut_Params_t *)");
  }
  pParams->nIdsMax = pNtk->vObjs->nSize;
  p = Cut_ManStart(pParams);
  if ((pParams->fGlobal != 0) || (pParams->fLocal != 0)) {
    pVVar5 = Vec_IntStart(pNtk->vObjs->nSize + 1);
    uVar10 = 0;
    uVar13 = 0;
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar12);
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        uVar2 = *(uint *)&pAVar6->field_0x14;
        uVar9 = uVar2 & 0xf;
        if ((0xfffffffd < uVar9 - 5) &&
           (pNode = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray],
           (*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar1 = Abc_NodeMffcSize(pNode);
          uVar13 = uVar13 + iVar1;
          uVar2 = *(uint *)&pAVar6->field_0x14;
        }
        uVar10 = (ulong)((int)uVar10 + (uint)(uVar9 == 7));
        if ((((uVar2 & 0xf) == 7) && (1 < (pAVar6->vFanouts).nSize)) &&
           (iVar1 = Abc_NodeIsMuxControlType(pAVar6), iVar1 == 0)) {
          iVar1 = Abc_NodeMffcSize(pAVar6);
          iVar3 = Abc_NodeMffcSize(pAVar6);
          uVar13 = iVar3 + uVar13;
          if ((2 < iVar1) || (8 < (pAVar6->vFanouts).nSize)) {
            Vec_IntWriteEntry(pVVar5,pAVar6->Id,1);
          }
        }
      }
    }
    printf("Total nodes = %d. Total MFFC nodes = %d.\n",uVar10,(ulong)uVar13);
    Cut_ManSetNodeAttrs(p,pVVar5);
  }
  if (pParams->fDrop != 0) {
    pVVar5 = Abc_NtkFanoutCounts(pNtk);
    Cut_ManSetFanoutCounts(p,pVVar5);
  }
  for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
    pAVar6 = Abc_NtkCi(pNtk,iVar12);
    if (0 < (pAVar6->vFanouts).nSize) {
      Cut_NodeSetTriv(p,pAVar6->Id);
    }
  }
  iVar12 = 0;
  p_00 = Abc_AigDfs(pNtk,0,1);
  pVVar5 = Vec_IntAlloc(100);
  p_01 = Extra_ProgressBarStart(_stdout,p_00->nSize);
  do {
    if (p_00->nSize <= iVar12) {
      Extra_ProgressBarStop(p_01);
      Vec_PtrFree(p_00);
      free(pVVar5->pArray);
      free(pVVar5);
      pCVar11 = p;
      Cut_ManPrintStats(p);
      iVar12 = (int)pCVar11;
      Abc_Print(iVar12,"%s =","TOTAL");
      aVar8 = Abc_Clock();
      Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar8 - aVar4) / 1000000.0);
      if (nTotal != 0) {
        printf("Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n",(double)nGood / (double)nTotal);
      }
      if (pParams->fAdjust != 0) {
        Abc_NtkCutsAddFanunt(pNtk);
      }
      return p;
    }
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar12);
    if ((*(uint *)&pAVar6->field_0x14 & 0xf) - 5 < 0xfffffffe) {
      if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar12)) {
        Extra_ProgressBarUpdate_int(p_01,iVar12,(char *)0x0);
      }
      puVar7 = (uint *)Abc_NodeGetCuts(p,pAVar6,pParams->fDag,pParams->fTree);
      if ((pParams->fNpnSave != 0) && (puVar7 != (uint *)0x0)) {
        for (; puVar7 != (uint *)0x0; puVar7 = *(uint **)(puVar7 + 4)) {
          uVar13 = *puVar7;
          if (0x3fffffff < uVar13) {
            Npn_ManSaveOne((uint *)((long)puVar7 + (ulong)(uVar13 >> 0x16 & 0x3c) + 0x18),
                           uVar13 >> 0x1c);
          }
        }
      }
      if (pParams->fDrop != 0) {
        Cut_NodeTryDroppingCuts(p,*(pAVar6->vFanins).pArray);
        Cut_NodeTryDroppingCuts(p,(pAVar6->vFanins).pArray[1]);
      }
      if (((ulong)pAVar6 & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0026bf8b:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (pAVar6->pNtk->ntkType != ABC_NTK_STRASH) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_0026bf8b;
      }
      if (((pAVar6->field_5).pData != (void *)0x0) && (0 < (pAVar6->vFanouts).nSize)) {
        pVVar5->nSize = 0;
        for (; pAVar6 != (Abc_Obj_t *)0x0; pAVar6 = (Abc_Obj_t *)(pAVar6->field_5).pData) {
          iVar1 = pAVar6->Id;
          iVar3 = pVVar5->nSize;
          if (iVar3 == pVVar5->nCap) {
            nCapMin = iVar3 * 2;
            if (iVar3 < 0x10) {
              nCapMin = 0x10;
            }
            Vec_IntGrow(pVVar5,nCapMin);
            iVar3 = pVVar5->nSize;
          }
          pVVar5->nSize = iVar3 + 1;
          pVVar5->pArray[iVar3] = iVar1;
        }
        Cut_NodeUnionCuts(p,pVVar5);
      }
    }
    else if (pParams->fDrop != 0) {
      Cut_NodeTryDroppingCuts(p,*(pAVar6->vFanins).pArray);
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams )
{
    ProgressBar * pProgress;
    Cut_Man_t * p;
    Cut_Cut_t * pList;
    Abc_Obj_t * pObj, * pNode;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vChoices;
    int i;
    abctime clk = Abc_Clock();

    extern void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk );
    extern void Abc_NtkBalanceDetach( Abc_Ntk_t * pNtk );

    if ( pParams->fAdjust )
    Abc_NtkCutsSubtractFanunt( pNtk );

    nTotal = nGood = nEqual = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the manager
    pParams->nIdsMax = Abc_NtkObjNumMax( pNtk );
    p = Cut_ManStart( pParams );
    // compute node attributes if local or global cuts are requested
    if ( pParams->fGlobal || pParams->fLocal )
    {
        extern Vec_Int_t * Abc_NtkGetNodeAttributes( Abc_Ntk_t * pNtk );
        Cut_ManSetNodeAttrs( p, Abc_NtkGetNodeAttributes(pNtk) );
    }
    // prepare for cut dropping
    if ( pParams->fDrop )
        Cut_ManSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );
    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_NodeSetTriv( p, pObj->Id );
    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    vChoices = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vNodes) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( pParams->fDrop )
                Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // compute the cuts to the internal node
        pList = (Cut_Cut_t *)Abc_NodeGetCuts( p, pObj, pParams->fDag, pParams->fTree );
        if ( pParams->fNpnSave && pList )
        {
            extern void Npn_ManSaveOne( unsigned * puTruth, int nVars );
            Cut_Cut_t * pCut;
            for ( pCut = pList; pCut; pCut = pCut->pNext )
                if ( pCut->nLeaves >= 4 )
                    Npn_ManSaveOne( Cut_CutReadTruth(pCut), pCut->nLeaves );
        }
        // consider dropping the fanins cuts
        if ( pParams->fDrop )
        {
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
        // add cuts due to choices
        if ( Abc_AigNodeIsChoice(pObj) )
        {
            Vec_IntClear( vChoices );
            for ( pNode = pObj; pNode; pNode = (Abc_Obj_t *)pNode->pData )
                Vec_IntPush( vChoices, pNode->Id );
            Cut_NodeUnionCuts( p, vChoices );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vChoices );
    Cut_ManPrintStats( p );
ABC_PRT( "TOTAL", Abc_Clock() - clk );
//    printf( "Area = %d.\n", Abc_NtkComputeArea( pNtk, p ) );
//Abc_NtkPrintCuts( p, pNtk, 0 );
//    Cut_ManPrintStatsToFile( p, pNtk->pSpec, Abc_Clock() - clk );

    // temporary printout of stats
    if ( nTotal )
    printf( "Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n", nTotal, nGood, ((double)nGood)/nTotal );
    if ( pParams->fAdjust )
    Abc_NtkCutsAddFanunt( pNtk );
    return p;
}